

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O2

string_view __thiscall
absl::lts_20250127::ByLength::Find(ByLength *this,string_view text,size_t pos)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  ulong __pos;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view text_local;
  
  text_local._M_str = text._M_str;
  text_local._M_len = text._M_len;
  __pos = text_local._M_len;
  if (pos <= text_local._M_len) {
    __pos = pos;
  }
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&text_local,__pos,0xffffffffffffffff);
  pcVar2 = bVar3._M_str + this->length_;
  if (bVar3._M_len <= (ulong)this->length_) {
    pcVar2 = text_local._M_str + text_local._M_len;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = pcVar2;
  return (string_view)(auVar1 << 0x40);
}

Assistant:

absl::string_view ByLength::Find(absl::string_view text, size_t pos) const {
  pos = std::min(pos, text.size());  // truncate `pos`
  absl::string_view substr = text.substr(pos);
  // If the string is shorter than the chunk size we say we
  // "can't find the delimiter" so this will be the last chunk.
  if (substr.length() <= static_cast<size_t>(length_))
    return absl::string_view(text.data() + text.size(), 0);

  return absl::string_view(substr.data() + length_, 0);
}